

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

void __thiscall wabt::TypeChecker::PushType(TypeChecker *this,Type type)

{
  Type local_8;
  
  if (type.enum_ != Void) {
    local_8 = type;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(&this->type_stack_,&local_8);
  }
  return;
}

Assistant:

void TypeChecker::PushType(Type type) {
  if (type != Type::Void) {
    type_stack_.push_back(type);
  }
}